

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

int ON_SubDComponentAndNumber::CompareComponentAndDirection
              (ON_SubDComponentAndNumber *a,ON_SubDComponentAndNumber *b)

{
  int iVar1;
  
  if (a == b) {
    return 0;
  }
  if (a != (ON_SubDComponentAndNumber *)0x0) {
    if (b == (ON_SubDComponentAndNumber *)0x0) {
      return 1;
    }
    iVar1 = ON_SubDComponentPtr::CompareComponentAndDirection(&a->m_cptr,&b->m_cptr);
    return iVar1;
  }
  return -1;
}

Assistant:

int ON_SubDComponentAndNumber::CompareComponentAndDirection(
  const ON_SubDComponentAndNumber* a,
  const ON_SubDComponentAndNumber* b
)
{
  if (a == b)
    return 0;
  if (nullptr == a)
    return -1;
  if (nullptr == b)
    return 1;
  return ON_SubDComponentPtr::CompareComponentAndDirection(&a->m_cptr, &b->m_cptr);
}